

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembly<std::complex<long_double>_>::AssembleCoarse
          (TPZDohrAssembly<std::complex<long_double>_> *this,int isub,
          TPZFMatrix<std::complex<long_double>_> *local,
          TPZFMatrix<std::complex<long_double>_> *global)

{
  longdouble lVar1;
  uint uVar2;
  uint uVar3;
  TPZVec<int> *pTVar4;
  ulong uVar5;
  complex<long_double> *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong col;
  longdouble local_58;
  longdouble local_48;
  
  pTVar4 = (this->fCoarseEqs).fStore;
  uVar2 = (uint)pTVar4[isub].fNElements;
  uVar3 = (uint)(local->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  col = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = col;
  }
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = col;
  }
  for (; col != uVar5; col = col + 1) {
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      (*(local->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(&local_58,local,uVar8,col);
      pcVar6 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (global,(long)pTVar4[isub].fStore[uVar8],col);
      lVar1 = *(longdouble *)(pcVar6->_M_value + 0x10);
      *(longdouble *)pcVar6->_M_value = *(longdouble *)pcVar6->_M_value + local_58;
      *(longdouble *)(pcVar6->_M_value + 0x10) = lVar1 + local_48;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::AssembleCoarse(int isub, const TPZFMatrix<TVar> &local, TPZFMatrix<TVar> &global) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = local.Cols();
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            global(avec[ieq],ic) += local.GetVal(ieq,ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Assembling destination indices " << avec << std::endl;
		local.Print("Input vector",sout);
		global.Print("Resulting vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}